

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::SetStopTimePassed(cmCTestMultiProcessHandler *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  char *local_1a8 [4];
  ostringstream cmCTestLog_msg;
  
  if (this->StopTimePassed == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar1 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "The stop time has been passed. Stopping all tests.");
    std::endl<char,std::char_traits<char>>(poVar1);
    this_00 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x1b9,local_1a8[0],false);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    this->StopTimePassed = true;
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::SetStopTimePassed()
{
  if (!this->StopTimePassed) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "The stop time has been passed. "
               "Stopping all tests."
                 << std::endl);
    this->StopTimePassed = true;
  }
}